

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O3

void __thiscall
cmGraphVizWriter::WriteConnections
          (cmGraphVizWriter *this,string *targetName,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *insertedNodes,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *insertedConnections,cmGeneratedFileStream *str)

{
  const_iterator cVar1;
  const_iterator cVar2;
  iterator iVar3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  cmGlobalGenerator *globalGenerator;
  LinkLibraryScopeType *type;
  _Link_type __x;
  _Link_type __k;
  string myNodeName;
  string connectionName;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
  ll;
  cmGlobalGenerator *local_e8;
  long local_e0;
  undefined1 local_d8 [48];
  undefined1 local_a8 [48];
  _Base_ptr local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
  local_60;
  
  local_a8._40_8_ = &this->TargetPtrs;
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
                  *)local_a8._40_8_,targetName);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header) {
    WriteNode(this,targetName,*(cmGeneratorTarget **)(cVar1._M_node + 2),insertedNodes,str);
    if (*(long *)(cVar1._M_node + 2) != 0) {
      local_70._8_8_ = &this->TargetNamesNodes;
      local_a8._32_8_ = targetName;
      cVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_70._8_8_,targetName);
      globalGenerator = (cmGlobalGenerator *)local_d8;
      local_e8 = globalGenerator;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e8,*(long *)(cVar2._M_node + 2),
                 (long)&(cVar2._M_node[2]._M_parent)->_M_color + *(long *)(cVar2._M_node + 2));
      __x = (_Link_type)**(undefined8 **)(cVar1._M_node + 2);
      (anonymous_namespace)::getScopedLinkLibrariesFromTarget_abi_cxx11_
                (&local_60,(_anonymous_namespace_ *)__x,(cmTarget *)this->GlobalGenerator,
                 globalGenerator);
      if ((_Rb_tree_header *)local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_60._M_t._M_impl.super__Rb_tree_header) {
        local_70._M_allocated_capacity =
             (size_type)&(this->TargetNamesNodes)._M_t._M_impl.super__Rb_tree_header;
        local_78 = &(insertedConnections->_M_t)._M_impl.super__Rb_tree_header._M_header;
        p_Var5 = local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          __k = (_Link_type)(p_Var5 + 1);
          __x = __k;
          cVar2 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_70._8_8_,(key_type *)__k);
          if (cVar2._M_node != (_Base_ptr)local_70._M_allocated_capacity) {
            local_a8._0_8_ = local_a8 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_a8,local_e8,
                       (long)&local_e8->_vptr_cmGlobalGenerator + local_e0);
            std::__cxx11::string::append((char *)local_a8);
            std::__cxx11::string::_M_append((char *)local_a8,*(ulong *)(cVar2._M_node + 2));
            __x = (_Link_type)local_a8;
            iVar3 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find(&insertedConnections->_M_t,(key_type *)local_a8);
            if (iVar3._M_node == local_78) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)insertedConnections,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a8);
              cVar1 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
                      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
                              *)local_a8._40_8_,(key_type *)__k);
              WriteNode(this,(string *)__k,*(cmGeneratorTarget **)(cVar1._M_node + 2),insertedNodes,
                        str);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)str,"    \"",5);
              poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)str,(char *)local_e8,local_e0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" -> \"",6);
              poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar4,*(char **)(cVar2._M_node + 2),
                                  (long)cVar2._M_node[2]._M_parent);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
              (anonymous_namespace)::getLinkLibraryStyle_abi_cxx11_
                        ((string *)(local_d8 + 0x10),
                         (_anonymous_namespace_ *)(ulong)p_Var5[2]._M_color,type);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)str,(char *)local_d8._16_8_,local_d8._24_8_);
              if ((undefined1 *)local_d8._16_8_ != local_d8 + 0x20) {
                operator_delete((void *)local_d8._16_8_,local_d8._32_8_ + 1);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)str," // ",4);
              poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)str,*(char **)local_a8._32_8_,
                                  *(size_type *)(local_a8._32_8_ + 8));
              std::__ostream_insert<char,std::char_traits<char>>(poVar4," -> ",4);
              poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar4,*(char **)(p_Var5 + 1),(long)p_Var5[1]._M_parent);
              std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
              std::ostream::put((char)poVar4);
              std::ostream::flush();
              WriteConnections(this,(string *)__k,insertedNodes,insertedConnections,str);
              __x = __k;
            }
            if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
              __x = (_Link_type)((long)(_Rb_tree_color *)local_a8._16_8_ + 1);
              operator_delete((void *)local_a8._0_8_,(ulong)__x);
            }
          }
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
        } while ((_Rb_tree_header *)p_Var5 != &local_60._M_t._M_impl.super__Rb_tree_header);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
      ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
                  *)local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,__x);
      if (local_e8 != (cmGlobalGenerator *)local_d8) {
        operator_delete(local_e8,local_d8._0_8_ + 1);
      }
    }
  }
  return;
}

Assistant:

void cmGraphVizWriter::WriteConnections(
  const std::string& targetName, std::set<std::string>& insertedNodes,
  std::set<std::string>& insertedConnections, cmGeneratedFileStream& str) const
{
  std::map<std::string, const cmGeneratorTarget*>::const_iterator targetPtrIt =
    this->TargetPtrs.find(targetName);

  if (targetPtrIt == this->TargetPtrs.end()) // not found at all
  {
    return;
  }

  this->WriteNode(targetName, targetPtrIt->second, insertedNodes, str);

  if (targetPtrIt->second == nullptr) // it's an external library
  {
    return;
  }

  std::string myNodeName = this->TargetNamesNodes.find(targetName)->second;
  std::map<std::string, LinkLibraryScopeType> ll =
    getScopedLinkLibrariesFromTarget(targetPtrIt->second->Target,
                                     GlobalGenerator);

  for (auto const& llit : ll) {
    const std::string& libName = llit.first;
    std::map<std::string, std::string>::const_iterator libNameIt =
      this->TargetNamesNodes.find(libName);

    // can happen e.g. if GRAPHVIZ_TARGET_IGNORE_REGEX is used
    if (libNameIt == this->TargetNamesNodes.end()) {
      continue;
    }

    std::string connectionName = myNodeName;
    connectionName += "-";
    connectionName += libNameIt->second;
    if (insertedConnections.find(connectionName) ==
        insertedConnections.end()) {
      insertedConnections.insert(connectionName);
      this->WriteNode(libName, this->TargetPtrs.find(libName)->second,
                      insertedNodes, str);

      str << "    \"" << myNodeName << "\" -> \"" << libNameIt->second << "\"";

      str << getLinkLibraryStyle(llit.second);

      str << " // " << targetName << " -> " << libName << std::endl;
      this->WriteConnections(libName, insertedNodes, insertedConnections, str);
    }
  }
}